

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ClearStatTables(Parse *pParse,int iDb,char *zType,char *zName)

{
  long lVar1;
  char *zDatabase;
  Table *pTVar2;
  uint uVar3;
  long in_FS_OFFSET;
  char zTab [24];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  zDatabase = pParse->db->aDb[iDb].zDbSName;
  for (uVar3 = 1; uVar3 != 5; uVar3 = uVar3 + 1) {
    sqlite3_snprintf(0x18,zTab,"sqlite_stat%d",(ulong)uVar3);
    pTVar2 = sqlite3FindTable(pParse->db,zTab,zDatabase);
    if (pTVar2 != (Table *)0x0) {
      sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE %s=%Q",zDatabase,zTab,zType,zName);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void sqlite3ClearStatTables(
  Parse *pParse,         /* The parsing context */
  int iDb,               /* The database number */
  const char *zType,     /* "idx" or "tbl" */
  const char *zName      /* Name of index or table */
){
  int i;
  const char *zDbName = pParse->db->aDb[iDb].zDbSName;
  for(i=1; i<=4; i++){
    char zTab[24];
    sqlite3_snprintf(sizeof(zTab),zTab,"sqlite_stat%d",i);
    if( sqlite3FindTable(pParse->db, zTab, zDbName) ){
      sqlite3NestedParse(pParse,
        "DELETE FROM %Q.%s WHERE %s=%Q",
        zDbName, zTab, zType, zName
      );
    }
  }
}